

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::GenerateFastInlineHasOwnProperty(Lowerer *this,Instr *instr)

{
  short sVar1;
  _func_int **pp_Var2;
  Instr *argoutInlineSpecialized;
  ScriptContextInfo *pSVar3;
  code *pcVar4;
  Opnd *baseOpnd;
  bool bVar5;
  OpndKind OVar6;
  int iVar7;
  DWORD offset;
  undefined4 *puVar8;
  Opnd *pOVar9;
  LabelInstr *labelTarget;
  IndirOpnd *pIVar10;
  undefined4 extraout_var;
  AddrOpnd *pAVar11;
  RegOpnd *pRVar12;
  RegOpnd *pRVar13;
  LabelInstr *pLVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  IntConstOpnd *pIVar15;
  LabelInstr *target;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Lowerer *pLVar16;
  Lowerer *pLVar17;
  undefined4 uVar18;
  LabelInstr *local_80;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_6e;
  undefined4 local_6c;
  LabelInstr *local_68;
  RegOpnd *local_60;
  Lowerer *pLStack_58;
  Opnd *argsOpnd [2];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4f18,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar5) goto LAB_005a2ddd;
    *puVar8 = 0;
  }
  pOVar9 = instr->m_src2;
  OVar6 = IR::Opnd::GetKind(pOVar9);
  if (OVar6 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar5) goto LAB_005a2ddd;
    *puVar8 = 0;
  }
  pp_Var2 = pOVar9[1]._vptr_Opnd;
  if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    pOVar9 = (Opnd *)__tls_get_addr(&PTR_01548f08);
    *(undefined4 *)&pOVar9->_vptr_Opnd = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar5) goto LAB_005a2ddd;
    *(undefined4 *)&pOVar9->_vptr_Opnd = 0;
  }
  argoutInlineSpecialized = (Instr *)pp_Var2[5];
  pLStack_58 = (Lowerer *)0x0;
  argsOpnd[0] = (Opnd *)0x0;
  bVar5 = IR::Instr::FetchOperands(instr,(Opnd **)&pLStack_58,2);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    pOVar9 = (Opnd *)__tls_get_addr(&PTR_01548f08);
    *(undefined4 *)&pOVar9->_vptr_Opnd = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4f21,"(result)","result");
    if (!bVar5) goto LAB_005a2ddd;
    *(undefined4 *)&pOVar9->_vptr_Opnd = 0;
  }
  if (pLStack_58 == (Lowerer *)0x0 || argsOpnd[0] == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    pOVar9 = (Opnd *)__tls_get_addr(&PTR_01548f08);
    *(undefined4 *)&pOVar9->_vptr_Opnd = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4f22,"(argsOpnd[0] && argsOpnd[1])","argsOpnd[0] && argsOpnd[1]");
    if (!bVar5) goto LAB_005a2ddd;
    *(undefined4 *)&pOVar9->_vptr_Opnd = 0;
  }
  local_32 = (argsOpnd[0]->m_valueType).field_0;
  bVar5 = ValueType::IsNotString((ValueType *)&local_32.field_0);
  if (!bVar5) {
    local_6e = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                &(pLStack_58->m_lowererMD).FloatPrefThreshold;
    bVar5 = ValueType::IsNotObject((ValueType *)&local_6e.field_0);
    if (bVar5) {
      return;
    }
    OVar6 = IR::Opnd::GetKind((Opnd *)pLStack_58);
    if (OVar6 != OpndKindReg) {
      return;
    }
    OVar6 = IR::Opnd::GetKind(argsOpnd[0]);
    pLVar17 = pLStack_58;
    if (OVar6 != OpndKindReg) {
      return;
    }
    OVar6 = IR::Opnd::GetKind((Opnd *)pLStack_58);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      pOVar9 = (Opnd *)__tls_get_addr(&PTR_01548f08);
      *(undefined4 *)&pOVar9->_vptr_Opnd = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_005a2ddd;
      *(undefined4 *)&pOVar9->_vptr_Opnd = 0;
    }
    baseOpnd = argsOpnd[0];
    OVar6 = IR::Opnd::GetKind(argsOpnd[0]);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      pOVar9 = (Opnd *)__tls_get_addr(&PTR_01548f08);
      *(undefined4 *)&pOVar9->_vptr_Opnd = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_005a2ddd;
      *(undefined4 *)&pOVar9->_vptr_Opnd = 0;
    }
    local_32 = (baseOpnd->m_valueType).field_0;
    bVar5 = ValueType::IsString((ValueType *)&local_32.field_0);
    if ((bVar5) && (((ulong)baseOpnd[1]._vptr_Opnd[3] & 1) != 0)) {
      sVar1 = *(short *)(baseOpnd[1]._vptr_Opnd[5] + 0x30);
      uVar18 = (undefined4)CONCAT71((int7)((ulong)pOVar9 >> 8),sVar1 == 0x220 || sVar1 == 0xe6);
    }
    else {
      uVar18 = 0;
    }
    local_68 = InsertLabel(false,instr->m_next);
    labelTarget = IR::LabelInstr::New(Label,instr->m_func,true);
    IR::Instr::InsertBefore(instr,&labelTarget->super_Instr);
    local_80 = labelTarget;
    local_6c = uVar18;
    if ((char)uVar18 != '\0') {
      local_80 = IR::LabelInstr::New(Label,this->m_func,true);
    }
    LowererMD::GenerateObjectTest
              (&this->m_lowererMD,baseOpnd,&labelTarget->super_Instr,labelTarget,false);
    pIVar10 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0,TyUint64,this->m_func,false);
    pSVar3 = ((labelTarget->super_Instr).m_func)->m_scriptContextInfo;
    iVar7 = (*pSVar3->_vptr_ScriptContextInfo[0x21])(pSVar3,3);
    pLVar16 = (Lowerer *)CONCAT44(extraout_var,iVar7);
    pAVar11 = IR::AddrOpnd::New(pLVar16,AddrOpndKindDynamicVtable,this->m_func,false,(Var)0x0);
    InsertCompareBranch(pLVar16,&pIVar10->super_Opnd,&pAVar11->super_Opnd,BrNeq_A,false,labelTarget,
                        &labelTarget->super_Instr,false);
    LowererMD::GenerateObjectTest
              (&this->m_lowererMD,(Opnd *)pLVar17,&labelTarget->super_Instr,labelTarget,false);
    pRVar12 = IR::RegOpnd::New(TyUint64,this->m_func);
    local_60 = pRVar12;
    pIVar10 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0x28,TyUint64,this->m_func,false);
    InsertMove(&pRVar12->super_Opnd,&pIVar10->super_Opnd,&labelTarget->super_Instr,true);
    pRVar13 = IR::RegOpnd::New(TyUint64,this->m_func);
    pIVar10 = IR::IndirOpnd::New((RegOpnd *)pLVar17,8,TyUint64,this->m_func,false);
    InsertMove(&pRVar13->super_Opnd,&pIVar10->super_Opnd,&labelTarget->super_Instr,true);
    pRVar12 = local_60;
    GenerateDynamicLoadPolymorphicInlineCacheSlot
              (this,&labelTarget->super_Instr,local_60,&pRVar13->super_Opnd);
    pLVar14 = IR::LabelInstr::New(Label,this->m_func,false);
    GenerateLocalInlineCacheCheck(&labelTarget->super_Instr,pRVar13,pRVar12,pLVar14,false);
    pOVar9 = instr->m_dst;
    iVar7 = (*instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[2])();
    pAVar11 = IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar7),AddrOpndKindDynamicVar,instr->m_func
                                ,true,(Var)0x0);
    InsertMove(pOVar9,&pAVar11->super_Opnd,&labelTarget->super_Instr,true);
    InsertBranch(Br,false,local_68,&labelTarget->super_Instr);
    IR::Instr::InsertBefore(&labelTarget->super_Instr,&pLVar14->super_Instr);
    pRVar12 = IR::RegOpnd::New(TyInt64,this->m_func);
    LowererMD::GenerateLoadTaggedType(&labelTarget->super_Instr,pRVar13,pRVar12);
    GenerateLocalInlineCacheCheck(&labelTarget->super_Instr,pRVar12,local_60,local_80,false);
    pOVar9 = instr->m_dst;
    iVar7 = (*instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[2])();
    pAVar11 = IR::AddrOpnd::New(CONCAT44(extraout_var_01,iVar7),AddrOpndKindDynamicVar,instr->m_func
                                ,true,(Var)0x0);
    InsertMove(pOVar9,&pAVar11->super_Opnd,&labelTarget->super_Instr,true);
    pLVar16 = (Lowerer *)&DAT_00000009;
    InsertBranch(Br,false,local_68,&labelTarget->super_Instr);
    if ((char)local_6c != '\0') {
      IR::Instr::InsertBefore(&labelTarget->super_Instr,&local_80->super_Instr);
      pOVar9 = argsOpnd[0];
      OVar6 = IR::Opnd::GetKind(argsOpnd[0]);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) {
LAB_005a2ddd:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar8 = 0;
      }
      local_60 = *(RegOpnd **)(pOVar9[1]._vptr_Opnd[5] + 0x48);
      pOVar9 = GetForInEnumeratorFieldOpnd(this,&local_60->super_Opnd,0x50,TyInt8);
      pLVar16 = (Lowerer *)0x0;
      pIVar15 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
      InsertCompareBranch(pLVar16,pOVar9,&pIVar15->super_Opnd,BrEq_A,false,labelTarget,
                          &labelTarget->super_Instr,false);
      pRVar13 = IR::RegOpnd::New(TyUint64,this->m_func);
      pRVar12 = local_60;
      pOVar9 = GetForInEnumeratorFieldOpnd(this,&local_60->super_Opnd,0x10,TyUint64);
      InsertMove(&pRVar13->super_Opnd,pOVar9,&labelTarget->super_Instr,true);
      offset = Js::DynamicObject::GetOffsetOfType();
      pIVar10 = IR::IndirOpnd::New((RegOpnd *)pLVar17,offset,TyUint64,this->m_func,false);
      InsertCompareBranch(pLVar17,&pRVar13->super_Opnd,&pIVar10->super_Opnd,BrNeq_A,false,
                          labelTarget,&labelTarget->super_Instr,false);
      target = IR::LabelInstr::New(Label,this->m_func,true);
      pOVar9 = GetForInEnumeratorFieldOpnd(this,&pRVar12->super_Opnd,0x51,TyInt8);
      pLVar17 = (Lowerer *)0x0;
      pIVar15 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,false);
      InsertCompareBranch(pLVar17,pOVar9,&pIVar15->super_Opnd,BrNeq_A,false,target,
                          &labelTarget->super_Instr,false);
      pOVar9 = instr->m_dst;
      iVar7 = (*instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[2])();
      pAVar11 = IR::AddrOpnd::New(CONCAT44(extraout_var_02,iVar7),AddrOpndKindDynamicVar,
                                  instr->m_func,true,(Var)0x0);
      InsertMove(pOVar9,&pAVar11->super_Opnd,&labelTarget->super_Instr,true);
      pLVar14 = local_68;
      InsertBranch(Br,false,local_68,&labelTarget->super_Instr);
      IR::Instr::InsertBefore(&labelTarget->super_Instr,&target->super_Instr);
      pOVar9 = instr->m_dst;
      iVar7 = (*instr->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[3])();
      pAVar11 = IR::AddrOpnd::New(CONCAT44(extraout_var_03,iVar7),AddrOpndKindDynamicVar,
                                  instr->m_func,true,(Var)0x0);
      InsertMove(pOVar9,&pAVar11->super_Opnd,&labelTarget->super_Instr,true);
      pLVar16 = (Lowerer *)&DAT_00000009;
      InsertBranch(Br,false,pLVar14,&labelTarget->super_Instr);
    }
    RelocateCallDirectToHelperPath(pLVar16,argoutInlineSpecialized,labelTarget);
  }
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineHasOwnProperty(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::CallDirect);

    //CallDirect src2
    IR::Opnd * linkOpnd = instr->GetSrc2();
    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = linkOpnd->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2] = { 0 };
    bool result = instr->FetchOperands(argsOpnd, 2);
    Assert(result);
    AnalysisAssert(argsOpnd[0] && argsOpnd[1]);

    if (argsOpnd[1]->GetValueType().IsNotString()
        || argsOpnd[0]->GetValueType().IsNotObject()
        || !argsOpnd[0]->IsRegOpnd()
        || !argsOpnd[1]->IsRegOpnd())
    {
        return;
    }

    IR::RegOpnd * thisObj = argsOpnd[0]->AsRegOpnd();
    IR::RegOpnd * propOpnd = argsOpnd[1]->AsRegOpnd();

    // fast path case where hasOwnProperty is being called using a property name loaded via a for-in loop
    bool generateForInFastpath = propOpnd->GetValueType().IsString()
        && propOpnd->m_sym->m_isSingleDef
        && (propOpnd->m_sym->m_instrDef->m_opcode == Js::OpCode::BrOnEmpty
            || propOpnd->m_sym->m_instrDef->m_opcode == Js::OpCode::BrOnNotEmpty);

    IR::LabelInstr * doneLabel = InsertLabel(false, instr->m_next);
    IR::LabelInstr * labelHelper = InsertLabel(true, instr);

    IR::LabelInstr * cacheMissLabel = generateForInFastpath ? IR::LabelInstr::New(Js::OpCode::Label, m_func, true) : labelHelper;

    IR::Instr * insertInstr = labelHelper;

    //    GenerateObjectTest(propOpnd, $labelHelper)
    //    CMP indexOpnd, PropertyString::`vtable'
    //    JNE $helper
    //    GenerateObjectTest(thisObj, $labelHelper)
    //    MOV inlineCacheOpnd, propOpnd->lsElemInlineCache
    //    MOV objectTypeOpnd, thisObj->type
    //    GenerateDynamicLoadPolymorphicInlineCacheSlot(inlineCacheOpnd, objectTypeOpnd)        ; loads inline cache for given type
    //    GenerateLocalInlineCacheCheck(objectTypeOpnd, inlineCacheOpnd, $notInlineSlotsLabel)  ; check for type in inline slots, jump to $notInlineSlotsLabel on failure
    //    MOV dst, ValueTrue
    //    JMP $done
    // $notInlineSlotsLabel:
    //    GenerateLoadTaggedType(objectTypeOpnd, opndTaggedType)
    //    GenerateLocalInlineCacheCheck(opndTaggedType, inlineCacheOpnd, $cacheMissLabel)       ; check for type in aux slot, jump to $cacheMissLabel on failure
    //    MOV dst, ValueTrue
    //    JMP $done

    m_lowererMD.GenerateObjectTest(propOpnd, insertInstr, labelHelper);

    InsertCompareBranch(IR::IndirOpnd::New(propOpnd, 0, TyMachPtr, m_func), LoadVTableValueOpnd(insertInstr, VTableValue::VtablePropertyString), Js::OpCode::BrNeq_A, labelHelper, insertInstr);

    m_lowererMD.GenerateObjectTest(thisObj, insertInstr, labelHelper);

    IR::RegOpnd * inlineCacheOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(inlineCacheOpnd, IR::IndirOpnd::New(propOpnd, Js::PropertyString::GetOffsetOfLdElemInlineCache(), TyMachPtr, m_func), insertInstr);

    IR::RegOpnd * objectTypeOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(objectTypeOpnd, IR::IndirOpnd::New(thisObj, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, m_func), insertInstr);

    GenerateDynamicLoadPolymorphicInlineCacheSlot(insertInstr, inlineCacheOpnd, objectTypeOpnd);

    IR::LabelInstr * notInlineSlotsLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    GenerateLocalInlineCacheCheck(insertInstr, objectTypeOpnd, inlineCacheOpnd, notInlineSlotsLabel);

    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), insertInstr);
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    insertInstr->InsertBefore(notInlineSlotsLabel);
    IR::RegOpnd * opndTaggedType = IR::RegOpnd::New(TyMachReg, m_func);
    m_lowererMD.GenerateLoadTaggedType(insertInstr, objectTypeOpnd, opndTaggedType);
    GenerateLocalInlineCacheCheck(insertInstr, opndTaggedType, inlineCacheOpnd, cacheMissLabel);
    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), insertInstr);
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    if (!generateForInFastpath)
    {
        RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
        return;
    }

    insertInstr->InsertBefore(cacheMissLabel);

    //    CMP forInEnumeratorOpnd->canUseJitFastPath, 0
    //    JEQ $labelHelper
    //    MOV cachedDataTypeOpnd, forInEnumeratorOpnd->enumeratorInitialType
    //    CMP thisObj->type, cachedDataTypeOpnd
    //    JNE $labelHelper
    //    CMP forInEnumeratorOpnd->enumeratingPrototype, 0
    //    JNE $falseLabel
    //    MOV dst, True
    //    JMP $doneLabel
    //    $falseLabel: [helper]
    //    MOV dst, False
    //    JMP $doneLabel
    // $labelHelper: [helper]
    //    CallDirect code
    //    ...
    // $doneLabel:

    IR::Opnd * forInEnumeratorOpnd = argsOpnd[1]->AsRegOpnd()->m_sym->m_instrDef->GetSrc1();

    // go to helper if we can't use JIT fastpath
    IR::Opnd * canUseJitFastPathOpnd = GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfCanUseJitFastPath(), TyInt8);
    InsertCompareBranch(canUseJitFastPathOpnd, IR::IntConstOpnd::New(0, TyInt8, m_func), Js::OpCode::BrEq_A, labelHelper, insertInstr);

    // go to helper if initial type is not same as the object we are querying
    IR::RegOpnd * cachedDataTypeOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(cachedDataTypeOpnd, GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratorInitialType(), TyMachPtr), insertInstr);
    InsertCompareBranch(cachedDataTypeOpnd, IR::IndirOpnd::New(thisObj, Js::DynamicObject::GetOffsetOfType(), TyMachPtr, m_func), Js::OpCode::BrNeq_A, labelHelper, insertInstr);

    // if we haven't yet gone to helper, then we can check if we are enumerating the prototype to know if property is an own property
    IR::LabelInstr *falseLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::Opnd * enumeratingPrototype = GetForInEnumeratorFieldOpnd(forInEnumeratorOpnd, Js::ForInObjectEnumerator::GetOffsetOfEnumeratingPrototype(), TyInt8);
    InsertCompareBranch(enumeratingPrototype, IR::IntConstOpnd::New(0, TyInt8, m_func), Js::OpCode::BrNeq_A, falseLabel, insertInstr);

    // assume true is the main path
    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueTrue), insertInstr);
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    // load false on helper path
    insertInstr->InsertBefore(falseLabel);
    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse), insertInstr);
    InsertBranch(Js::OpCode::Br, doneLabel, insertInstr);

    RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
}